

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.hpp
# Opt level: O2

optional_idx __thiscall
duckdb::PartitionedColumnDataAppendState::GetPartitionIndexIfSinglePartition
          (PartitionedColumnDataAppendState *this,bool use_fixed_size_map)

{
  iterator *this_00;
  undefined7 in_register_00000031;
  _Hash_node_base *index;
  optional_idx local_28;
  iterator local_20;
  
  this_00 = (iterator *)&local_28;
  if ((int)CONCAT71(in_register_00000031,use_fixed_size_map) == 0) {
    if ((this->partition_entries)._M_h._M_element_count != 1) {
      return (optional_idx)0xffffffffffffffff;
    }
    index = (this->partition_entries)._M_h._M_before_begin._M_nxt[1]._M_nxt;
    this_00 = &local_20;
  }
  else {
    if ((this->fixed_partition_entries).count != 1) {
      return (optional_idx)0xffffffffffffffff;
    }
    fixed_size_map_t<duckdb::list_entry_t>::begin(&local_20,&this->fixed_partition_entries);
    index = (_Hash_node_base *)(local_20.entry_idx * 8 + local_20.idx_in_entry);
  }
  optional_idx::optional_idx((optional_idx *)this_00,(idx_t)index);
  return (optional_idx)(idx_t)this_00->map;
}

Assistant:

optional_idx GetPartitionIndexIfSinglePartition(const bool use_fixed_size_map) {
		optional_idx result;
		if (use_fixed_size_map) {
			if (fixed_partition_entries.size() == 1) {
				result = fixed_partition_entries.begin().GetKey();
			}
		} else {
			if (partition_entries.size() == 1) {
				result = partition_entries.begin()->first;
			}
		}
		return result;
	}